

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifinpevt(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  runsdef *prVar2;
  runcxdef *ctx_00;
  uint16_t tmp_2;
  int iVar3;
  int32_t tmp_1;
  undefined1 *__src;
  uint16_t tmp;
  uint uVar4;
  os_event_info_t *info_00;
  size_t unaff_R14;
  uint siz;
  unsigned_long unaff_R15;
  runsdef val;
  char keyname [20];
  os_event_info_t info;
  runsdef local_158;
  undefined1 local_148 [288];
  
  if (argc == 0) {
    unaff_R14 = 0;
    unaff_R15 = 0;
  }
  else if (0 < argc) {
    prVar2 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    unaff_R15 = (ctx->bifcxrun->runcxsp->runsv).runsvnum;
    unaff_R14 = 1;
  }
  if (1 < argc) {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x401);
  }
  outflushn(0);
  outreset();
  info_00 = (os_event_info_t *)(local_148 + 0x20);
  iVar3 = os_get_event(unaff_R15,(int)unaff_R14,info_00);
  if (iVar3 == 3) {
LAB_00214276:
    unaff_R14 = strlen(info_00->href);
    uVar4 = (int)unaff_R14 + 10;
  }
  else {
    if (iVar3 == 1) {
      info_00 = (os_event_info_t *)local_148;
      get_ext_key_name(info_00->href,local_148._32_4_,local_148._36_4_);
      goto LAB_00214276;
    }
    uVar4 = 7;
  }
  ctx_00 = ctx->bifcxrun;
  siz = uVar4 & 0xffff;
  if ((uint)(*(int *)&ctx_00->runcxhtop - *(int *)&ctx_00->runcxhp) <= siz) {
    runhcmp(ctx_00,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
  }
  local_158.runstyp = '\a';
  local_158.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
  *(short *)local_158.runsv.runsvstr = (short)uVar4;
  *(uchar *)(local_158.runsv.runsvnum + 2) = '\x01';
  *(int *)(local_158.runsv.runsvnum + 3) = iVar3;
  if (iVar3 == 3) {
    *(uchar *)(local_158.runsv.runsvnum + 7) = '\x03';
    *(short *)(local_158.runsv.runsvnum + 8) = (short)unaff_R14 + 2;
    __src = local_148 + 0x20;
  }
  else {
    if (iVar3 != 1) goto LAB_0021430f;
    *(uchar *)(local_158.runsv.runsvnum + 7) = '\x03';
    *(short *)(local_158.runsv.runsvnum + 8) = (short)unaff_R14 + 2;
    __src = local_148;
  }
  memcpy((uchar *)(local_158.runsv.runsvnum + 10),__src,unaff_R14);
LAB_0021430f:
  ppuVar1 = &ctx->bifcxrun->runcxhp;
  *ppuVar1 = *ppuVar1 + siz;
  runrepush(ctx->bifcxrun,&local_158);
  return;
}

Assistant:

void bifinpevt(bifcxdef *ctx, int argc)
{
    unsigned long timeout;
    int use_timeout;
    os_event_info_t info;
    int evt;
    uchar *p;
    ushort lstsiz;
    runsdef val;
    size_t paramlen;
    char keyname[20];
    
    /* check for a timeout value */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (argc >= 1)
    {
        /* get the timeout value */
        use_timeout = TRUE;
        timeout = (unsigned long)runpopnum(ctx->bifcxrun);
    }

    /* ensure we don't have too many arguments */
    if (argc > 1)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* flush any pending output */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since keyboard input */
    tioreset(ctx->bifcxtio);

    /* ask the OS code for an event */
    evt = os_get_event(timeout, use_timeout, &info);

    /* 
     *   the list always minimally needs two bytes of length prefix plus a
     *   number with the event code (one byte for the type, four bytes for
     *   the value) 
     */
    lstsiz = 2 + (1 + 4);

    /* figure out how much space we'll need based on the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need space for a string with one or two bytes (depending
         *   on whether or not we have an extended key code) - 1 byte for
         *   type code, 2 for length prefix, and 1 or 2 for the string's
         *   contents 
         */
        paramlen = (info.key[0] == 0 ? 2 : 1);

        /* map the extended key */
        get_ext_key_name(keyname, info.key[0], info.key[1]);

        /* determine the length we need for the string */
        paramlen = strlen(keyname);

        /* add it into the list */
        lstsiz += 1 + 2 + paramlen;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need space for the href string - 1 byte for type code, 2
         *   for length prefix, plus the string's contents 
         */
        paramlen = strlen(info.href);
        lstsiz += 1 + 2 + (ushort)paramlen;
        break;

    default:
        /* other event types have no extra data */
        break;
    }

    /* allocate space for the list */
    runhres(ctx->bifcxrun, lstsiz, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* set up the list length prefix */
    oswp2(p, lstsiz);
    p += 2;

    /* set up the event type element */
    *p++ = DAT_NUMBER;
    oswp4s(p, evt);
    p += 4;

    /* add the event parameters, if any */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* set up the string for the key */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        p += 2;

        /* add the characters to the string */
        memcpy(p, keyname, paramlen);
        p += paramlen;
        break;

    case OS_EVT_HREF:
        /* add the string for the href */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        memcpy(p + 2, info.href, paramlen);
        break;
    }

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += lstsiz;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}